

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * __thiscall
cs::codecvt::gbk::wide2local(string *__return_storage_ptr__,gbk *this,u32string *wide)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_48 = 0;
  local_40 = '\0';
  sVar1 = wide->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    pcVar2 = (wide->_M_dataplus)._M_p;
    lVar3 = 0;
    local_50._M_p = &local_40;
    do {
      if ((short)*(undefined4 *)((long)pcVar2 + lVar3) < 0) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      std::__cxx11::string::push_back((char)&local_50);
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_50._M_p != &local_40) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      goto LAB_002ade17;
    }
  }
  (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
LAB_002ade17:
  __return_storage_ptr__->_M_string_length = local_48;
  return __return_storage_ptr__;
}

Assistant:

std::string wide2local(const std::u32string &wide) override
			{
				std::string local;
				for (auto &ch: wide) {
					if (ch & u32_blck_begin)
						local.push_back(ch >> 8);
					local.push_back(ch);
				}
				return std::move(local);
			}